

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64wd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *out,int_t *pr,int_t *q,int_t *l,double *u,double *d__)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *pos0;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  double *pdVar11;
  int_t *piVar12;
  ulong uVar13;
  int_t *piVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int_t *piVar18;
  long lVar19;
  uint uVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double dVar24;
  uint local_118;
  uint local_114;
  uint *local_110;
  uint local_104;
  double *local_100;
  double *local_f8;
  int_t *local_f0;
  int_t local_e4;
  int_t *local_e0;
  int *local_d8;
  ulong local_d0;
  int_t *local_c8;
  int_t *local_c0;
  double *local_b8;
  int_t *local_b0;
  int local_a4;
  double *local_a0;
  int_t *local_98;
  int_t *local_90;
  int local_84;
  double *local_80;
  int_t *local_78;
  uint *local_70;
  ulong local_68;
  double local_60;
  long local_58;
  ulong local_50;
  long local_48;
  int_t *local_40;
  double *local_38;
  
  local_e4 = 2;
  local_e0 = irn;
  local_b8 = a;
  pdVar21 = (double *)dmach("Overflow");
  *num = 0;
  uVar6 = *n;
  if (0 < (int)uVar6) {
    lVar7 = 0;
    do {
      *(double **)((long)u + lVar7 * 2) = pdVar21;
      *(undefined8 *)((long)d__ + lVar7 * 2) = 0;
      *(undefined4 *)((long)iperm + lVar7) = 0;
      *(undefined4 *)((long)jperm + lVar7) = 0;
      *(undefined4 *)((long)pr + lVar7) = *(undefined4 *)((long)ip + lVar7);
      *(undefined4 *)((long)l + lVar7) = 0;
      lVar7 = lVar7 + 4;
    } while ((ulong)uVar6 << 2 != lVar7);
  }
  local_c0 = l + -1;
  uVar6 = *n;
  piVar12 = jperm;
  if (0 < (int)uVar6) {
    lVar7 = 1;
    do {
      iVar5 = ip[lVar7];
      iVar1 = ip[lVar7 + -1];
      lVar8 = (long)iVar1;
      if (iVar1 < iVar5) {
        lVar9 = 0;
        do {
          dVar24 = local_b8[lVar8 + lVar9 + -1];
          lVar19 = (long)local_e0[lVar8 + lVar9 + -1];
          if (dVar24 < u[lVar19 + -1] || dVar24 == u[lVar19 + -1]) {
            u[lVar19 + -1] = dVar24;
            iperm[lVar19 + -1] = (int)lVar7;
            local_c0[lVar19] = iVar1 + (int)lVar9;
          }
          lVar9 = lVar9 + 1;
        } while (iVar5 - lVar8 != lVar9);
      }
      lVar7 = lVar7 + 1;
      piVar12 = local_c0;
    } while (lVar7 != (ulong)uVar6 + 1);
  }
  local_f0 = jperm + -1;
  uVar6 = *n;
  if ((int)uVar6 < 1) {
    lVar7 = 1;
  }
  else {
    lVar7 = 1;
    do {
      iVar5 = iperm[lVar7 + -1];
      lVar8 = (long)iVar5;
      if ((lVar8 != 0) && (iperm[lVar7 + -1] = 0, local_f0[lVar8] == 0)) {
        *num = *num + 1;
        iperm[lVar7 + -1] = iVar5;
        local_f0[lVar8] = l[lVar7 + -1];
      }
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar6 + 1 != lVar7);
  }
  local_98 = out + -1;
  local_118 = (uint)lVar7;
  uVar6 = *n;
  local_110 = (uint *)n;
  local_b0 = ip;
  if (*num != uVar6) {
    if (0 < (int)uVar6) {
      local_100 = (double *)((ulong)uVar6 + 1);
      piVar12 = local_e0 + -1;
      local_f8 = local_b8 + -1;
      pdVar11 = (double *)0x1;
      piVar14 = local_98;
      piVar18 = local_f0;
      do {
        if (local_f0[(long)pdVar11] == 0) {
          iVar5 = ip[(long)pdVar11 + -1];
          lVar7 = (long)iVar5;
          iVar1 = ip[(long)pdVar11];
          if (iVar5 < iVar1) {
            lVar8 = 0;
            pdVar23 = pdVar21;
            do {
              uVar6 = piVar12[lVar7 + lVar8];
              pdVar22 = (double *)(local_f8[lVar7 + lVar8] - u[(long)(int)uVar6 + -1]);
              if ((double)pdVar22 <= (double)pdVar23) {
                if ((double)pdVar23 <= (double)pdVar22) {
                  if ((((double)pdVar22 != (double)pdVar21) ||
                      (NAN((double)pdVar22) || NAN((double)pdVar21))) &&
                     ((iperm[(long)(int)uVar6 + -1] != 0 || (iperm[(long)(int)piVar18 + -1] == 0))))
                  goto LAB_00113138;
                }
                piVar14 = (int_t *)(ulong)(uint)(iVar5 + (int)lVar8);
                piVar18 = (int_t *)(ulong)uVar6;
                pdVar23 = pdVar22;
              }
LAB_00113138:
              lVar8 = lVar8 + 1;
            } while (iVar1 - lVar7 != lVar8);
            d__[(long)pdVar11 + -1] = (double)pdVar23;
            local_118 = (uint)piVar18;
            uVar17 = (ulong)piVar14 & 0xffffffff;
            if (iperm[(long)(int)local_118 + -1] == 0) {
LAB_001132b0:
              *num = *num + 1;
              local_f0[(long)pdVar11] = (int)uVar17;
              iperm[(long)(int)local_118 + -1] = (int)pdVar11;
              pr[(long)pdVar11 + -1] = (int)uVar17 + 1;
            }
            else if ((int)piVar14 < iVar1) {
              uVar17 = (ulong)(int)piVar14;
              do {
                local_118 = local_e0[uVar17 - 1];
                if (local_b8[uVar17 - 1] - u[(long)(int)local_118 + -1] <= (double)pdVar23) {
                  iVar5 = iperm[(long)(int)local_118 + -1];
                  iVar15 = pr[(long)iVar5 + -1];
                  iVar2 = ip[iVar5];
                  if (iVar15 < iVar2) {
                    lVar7 = 0;
                    do {
                      lVar8 = (long)piVar12[iVar15 + lVar7];
                      if ((iperm[lVar8 + -1] < 1) &&
                         (local_f8[iVar15 + lVar7] - u[lVar8 + -1] <= d__[(long)iVar5 + -1])) {
                        local_f0[iVar5] = iVar15 + (int)lVar7;
                        iperm[lVar8 + -1] = iVar5;
                        pr[(long)iVar5 + -1] = iVar15 + 1 + (int)lVar7;
                        goto LAB_001132b0;
                      }
                      lVar7 = lVar7 + 1;
                    } while ((iVar15 - iVar2) + (int)lVar7 != 0);
                    pr[(long)iVar5 + -1] = iVar2;
                  }
                }
                uVar17 = uVar17 + 1;
              } while (iVar1 != (int)uVar17);
            }
          }
        }
        pdVar11 = (double *)((long)pdVar11 + 1);
        local_c8 = piVar12;
      } while (pdVar11 != local_100);
    }
    uVar6 = *n;
    local_d8 = iperm;
    if (*num != uVar6) {
      if ((int)uVar6 < 1) {
        uVar17 = 1;
      }
      else {
        uVar17 = 1;
        do {
          d__[uVar17 - 1] = (double)pdVar21;
          l[uVar17 - 1] = 0;
          uVar17 = uVar17 + 1;
        } while ((ulong)uVar6 + 1 != uVar17);
      }
      local_118 = (uint)uVar17;
      if (0 < *n) {
        uVar17 = uVar17 & 0xffffffff;
        lVar7 = (ulong)(uint)*n + 1;
        local_78 = local_e0 + -1;
        local_80 = local_b8 + -1;
        local_40 = q + -2;
        lVar8 = 1;
        local_a0 = pdVar21;
        local_48 = lVar7;
        do {
          if (local_f0[lVar8] == 0) {
            uVar6 = *local_110;
            local_d0 = (ulong)uVar6;
            pr[lVar8 + -1] = -1;
            iVar5 = local_b0[lVar8];
            uVar20 = local_b0[lVar8 + -1];
            lVar7 = (long)(int)uVar20;
            uVar4 = 0;
            pdVar11 = pdVar21;
            local_f8 = pdVar21;
            if ((int)uVar20 < iVar5) {
              lVar9 = 0;
              do {
                uVar3 = local_78[lVar7 + lVar9];
                uVar17 = (ulong)uVar3;
                pdVar23 = (double *)(local_80[lVar7 + lVar9] - u[(long)(int)uVar3 + -1]);
                if ((double)pdVar23 < (double)pdVar11) {
                  if (iperm[(long)(int)uVar3 + -1] == 0) {
                    piVar12 = (int_t *)((ulong)uVar20 + lVar9);
                    local_a4 = (int)lVar8;
                    pdVar11 = pdVar23;
                  }
                  else {
                    d__[(long)(int)uVar3 + -1] = (double)pdVar23;
                    if ((double)local_f8 <= (double)pdVar23) {
                      pdVar23 = local_f8;
                    }
                    lVar19 = (long)(int)uVar4;
                    uVar4 = uVar4 + 1;
                    q[lVar19] = uVar20 + (int)lVar9;
                    local_f8 = pdVar23;
                  }
                }
                lVar9 = lVar9 + 1;
              } while (iVar5 - lVar7 != lVar9);
            }
            uVar6 = uVar6 + 1;
            local_114 = 0;
            piVar14 = local_c0;
            local_104 = uVar6;
            local_90 = piVar12;
            local_58 = lVar8;
            if ((int)uVar4 < 1) {
              uVar20 = 0;
            }
            else {
              piVar12 = (int_t *)(ulong)uVar4;
              piVar18 = (int_t *)0x0;
              uVar20 = 0;
              local_100 = pdVar11;
              local_c8 = piVar12;
              do {
                iVar5 = q[(long)piVar18];
                uVar4 = local_e0[(long)iVar5 + -1];
                uVar17 = (ulong)uVar4;
                if ((double)pdVar11 <= d__[(long)(int)uVar4 + -1]) {
                  d__[(long)(int)uVar4 + -1] = (double)pdVar21;
                }
                else {
                  if (d__[(long)(int)uVar4 + -1] <= (double)local_f8) {
                    lVar7 = (long)(int)uVar6;
                    uVar6 = uVar6 - 1;
                    q[lVar7 + -2] = uVar4;
                    piVar14[(int)uVar4] = uVar6;
                  }
                  else {
                    uVar20 = uVar20 + 1;
                    l[(long)(int)uVar4 + -1] = uVar20;
                    local_118 = uVar4;
                    mc64dd_((int_t *)&local_118,(int_t *)local_110,q,d__,l,&local_e4);
                    piVar12 = local_c8;
                    piVar14 = local_c0;
                    pdVar21 = local_a0;
                    pdVar11 = local_100;
                  }
                  iVar1 = local_d8[(long)(int)uVar4 + -1];
                  local_98[iVar1] = iVar5;
                  pr[(long)iVar1 + -1] = (int_t)local_58;
                }
                piVar18 = (int_t *)((long)piVar18 + 1);
              } while (piVar12 != piVar18);
            }
            iVar5 = *num;
            iperm = local_d8;
            local_114 = uVar20;
            if (0 < iVar5) {
              uVar16 = (ulong)(int)local_104;
              local_104 = ((int)local_d0 - iVar5) + 1;
              local_50 = 1;
              local_84 = iVar5;
              do {
                iperm = local_d8;
                if (uVar6 == (uint)uVar16) {
                  if (local_114 != 0) {
                    local_118 = *q;
                    uVar17 = (ulong)(int)local_118;
                    local_f8 = (double *)d__[uVar17 - 1];
                    if ((double)local_f8 < (double)pdVar11) {
                      piVar10 = local_40 + (int)uVar6;
                      local_100 = pdVar11;
                      local_d0 = uVar16;
                      do {
                        uVar6 = uVar6 - 1;
                        mc64ed_((int_t *)&local_114,(int_t *)local_110,q,d__,l,&local_e4);
                        *piVar10 = (int)uVar17;
                        l[(long)(int)uVar17 + -1] = uVar6;
                        piVar14 = local_c0;
                        uVar16 = local_d0;
                        pdVar21 = local_a0;
                        pdVar11 = local_100;
                        if (local_114 == 0) break;
                        uVar17 = (ulong)*q;
                        piVar10 = piVar10 + -1;
                      } while (d__[uVar17 - 1] <= (double)local_f8);
                      goto LAB_00113704;
                    }
                  }
LAB_001139af:
                  local_104 = (uint)uVar16;
                  break;
                }
LAB_00113704:
                piVar12 = local_78;
                lVar7 = (long)q[uVar16 - 2];
                if ((double)pdVar11 <= d__[lVar7 + -1]) goto LAB_001139af;
                uVar16 = uVar16 - 1;
                piVar18 = (int_t *)(long)iperm[lVar7 + -1];
                iVar5 = local_b0[(long)piVar18];
                uVar20 = local_b0[(long)piVar18 + -1];
                if ((int)uVar20 < iVar5) {
                  dVar24 = (d__[lVar7 + -1] - local_b8[(long)local_f0[(long)piVar18] + -1]) +
                           u[lVar7 + -1];
                  uVar13 = (ulong)uVar20;
                  pdVar23 = local_80 + (int)uVar20;
                  lVar7 = 0;
                  local_d0 = uVar16;
                  local_c8 = piVar18;
                  local_68 = uVar13;
                  local_60 = dVar24;
                  local_38 = pdVar23;
                  do {
                    uVar4 = piVar12[(int)uVar20 + lVar7];
                    uVar17 = (ulong)uVar4;
                    iVar1 = piVar14[(int)uVar4];
                    if (((long)iVar1 < (long)uVar16) &&
                       (pdVar22 = (double *)((pdVar23[lVar7] + dVar24) - u[(long)(int)uVar4 + -1]),
                       (double)pdVar22 < (double)pdVar11)) {
                      if (local_d8[(long)(int)uVar4 + -1] == 0) {
                        local_90 = (int_t *)(uVar13 + lVar7);
                        local_a4 = (int)local_c8;
                        pdVar11 = pdVar22;
                      }
                      else if (((double)pdVar22 < d__[(long)(int)uVar4 + -1]) &&
                              (iVar1 < (int)uVar6)) {
                        pos0 = (uint *)(piVar14 + (int)uVar4);
                        d__[(long)(int)uVar4 + -1] = (double)pdVar22;
                        local_118 = uVar4;
                        if ((double)pdVar22 <= (double)local_f8) {
                          if (iVar1 != 0) {
                            local_100 = pdVar11;
                            local_70 = pos0;
                            mc64fd_((int_t *)pos0,(int_t *)&local_114,(int_t *)local_110,q,d__,l,
                                    &local_e4);
                            pos0 = local_70;
                            uVar13 = local_68;
                            piVar14 = local_c0;
                            uVar16 = local_d0;
                            pdVar21 = local_a0;
                            pdVar11 = local_100;
                            dVar24 = local_60;
                          }
                          lVar8 = (long)(int)uVar6;
                          uVar6 = uVar6 - 1;
                          q[lVar8 + -2] = uVar4;
                          *pos0 = uVar6;
                        }
                        else {
                          if (iVar1 == 0) {
                            local_114 = local_114 + 1;
                            *pos0 = local_114;
                          }
                          local_100 = pdVar11;
                          mc64dd_((int_t *)&local_118,(int_t *)local_110,q,d__,l,&local_e4);
                          uVar13 = local_68;
                          piVar14 = local_c0;
                          uVar16 = local_d0;
                          pdVar21 = local_a0;
                          pdVar11 = local_100;
                          dVar24 = local_60;
                        }
                        iVar1 = local_d8[(long)(int)uVar4 + -1];
                        local_98[iVar1] = (int)uVar13 + (int)lVar7;
                        pr[(long)iVar1 + -1] = (int_t)local_c8;
                        pdVar23 = local_38;
                      }
                    }
                    lVar7 = lVar7 + 1;
                  } while ((uVar20 - iVar5) + (int)lVar7 != 0);
                }
                iVar5 = (int)local_50;
                local_50 = (ulong)(iVar5 + 1);
                iperm = local_d8;
              } while (iVar5 != local_84);
            }
            if (((double)pdVar11 != (double)pdVar21) ||
               (NAN((double)pdVar11) || NAN((double)pdVar21))) {
              *num = *num + 1;
              uVar17 = (ulong)local_e0[(long)(int)local_90 + -1];
              iperm[uVar17 - 1] = local_a4;
              lVar7 = (long)local_a4;
              local_f0[lVar7] = (int)local_90;
              iVar5 = *num;
              if (0 < iVar5) {
                do {
                  iVar1 = pr[lVar7 + -1];
                  if (iVar1 == -1) break;
                  iVar15 = local_98[lVar7];
                  uVar17 = (ulong)local_e0[(long)iVar15 + -1];
                  iperm[uVar17 - 1] = iVar1;
                  lVar7 = (long)iVar1;
                  local_f0[lVar7] = iVar15;
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
              }
              uVar20 = *local_110;
              if ((int)local_104 <= (int)uVar20) {
                lVar7 = -1;
                do {
                  uVar17 = (ulong)q[(int)local_104 + lVar7];
                  u[uVar17 - 1] = (u[uVar17 - 1] + d__[uVar17 - 1]) - (double)pdVar11;
                  lVar7 = lVar7 + 1;
                } while (uVar20 - local_104 != (int)lVar7);
              }
            }
            uVar20 = *local_110;
            if ((int)uVar6 <= (int)uVar20) {
              lVar7 = -1;
              do {
                uVar17 = (ulong)q[(int)uVar6 + lVar7];
                d__[uVar17 - 1] = (double)pdVar21;
                piVar14[uVar17] = 0;
                lVar7 = lVar7 + 1;
              } while (uVar20 - uVar6 != (int)lVar7);
            }
            if (0 < (int)local_114) {
              uVar16 = 0;
              do {
                uVar17 = (ulong)q[uVar16];
                d__[uVar17 - 1] = (double)pdVar21;
                piVar14[uVar17] = 0;
                uVar16 = uVar16 + 1;
              } while (local_114 != uVar16);
            }
            local_118 = (uint)uVar17;
            lVar7 = local_48;
            piVar12 = local_90;
            lVar8 = local_58;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar7);
      }
    }
  }
  piVar14 = local_98;
  piVar12 = local_f0;
  uVar6 = *local_110;
  if (0 < (int)uVar6) {
    uVar17 = 0;
    do {
      lVar7 = (long)jperm[uVar17];
      if (lVar7 == 0) {
        dVar24 = 0.0;
      }
      else {
        dVar24 = local_b8[lVar7 + -1] - u[(long)local_e0[lVar7 + -1] + -1];
      }
      d__[uVar17] = dVar24;
      if (iperm[uVar17] == 0) {
        u[uVar17] = 0.0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar6 != uVar17);
  }
  if (*num != uVar6) {
    if (0 < (int)uVar6) {
      memset(jperm,0,(ulong)uVar6 << 2);
    }
    uVar6 = *local_110;
    if (0 < (int)uVar6) {
      iVar5 = 0;
      lVar7 = 1;
      do {
        iVar15 = iVar5 + 1;
        iVar1 = iperm[lVar7 + -1];
        piVar18 = piVar12;
        if (iperm[lVar7 + -1] == 0) {
          iVar5 = iVar15;
          iVar1 = iVar15;
          piVar18 = piVar14;
        }
        piVar18[iVar1] = (int_t)lVar7;
        lVar7 = lVar7 + 1;
      } while ((ulong)uVar6 + 1 != lVar7);
    }
    uVar6 = *local_110;
    if (0 < (int)uVar6) {
      iVar5 = 0;
      lVar7 = 1;
      do {
        if (jperm[lVar7 + -1] == 0) {
          lVar8 = (long)iVar5;
          iVar5 = iVar5 + 1;
          iperm[(long)piVar14[lVar8 + 1] + -1] = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
      } while ((ulong)uVar6 + 1 != lVar7);
    }
  }
  return 0;
}

Assistant:

int_t mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *out, int_t *pr, int_t *q, int_t *l, double *u, 
	double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, c__2 = 2;

    /* Local variables */
    int_t i__, j, k, i0, k0, k1, k2, q0;
    double di;
    int_t ii, jj, kk;
    double vj;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dmin__, dnew;
    int_t jord, qlen, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(K). It is not altered. */
/*   All values A(K) must be non-negative. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   weighted matching: IPERM(I) = 0 or row I is matched to column */
/*   IPERM(I). */
/* NUM is an INT_T variable. On exit, it contains the cardinality of */
/*   the matching stored in IPERM. */
/* IW is an INT_T work array of length 5N. */
/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length 2N. */
/*   On exit, U = D(1:N) contains the dual row variable and */
/*   V = D(N+1:2N) contains the dual column variable. If the matrix */
/*   is structurally nonsingular (NUM = N), the following holds: */
/*      U(I)+V(J) <= A(I,J)  if IPERM(I) |= J */
/*      U(I)+V(J)  = A(I,J)  if IPERM(I)  = J */
/*      U(I) = 0  if IPERM(I) = 0 */
/*      V(J) = 0  if there is no I for which IPERM(I) = J */
/* Local variables */
/* Local parameters */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD */
/*      DOUBLE PRECISION FD05AD */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --u;
    --l;
    --q;
    --pr;
    --out;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	u[k] = rinf;
	d__[k] = 0.;
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	l[k] = 0;
/* L10: */
    }
/* Initialize U(I) */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] > u[i__]) {
		goto L20;
	    }
	    u[i__] = a[k];
	    iperm[i__] = j;
	    l[i__] = k;
L20:
	    ;
	}
/* L30: */
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = iperm[i__];
	if (j == 0) {
	    goto L40;
	}
/* Row I is not empty */
	iperm[i__] = 0;
	if (jperm[j] != 0) {
	    goto L40;
	}
/* Assignment of column J to row I */
	++(*num);
	iperm[i__] = j;
	jperm[j] = l[i__];
L40:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Scan unassigned columns; improve assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* JPERM(J) ne 0 iff column J is already assigned */
	if (jperm[j] != 0) {
	    goto L95;
	}
	k1 = ip[j];
	k2 = ip[j + 1] - 1;
/* Continue only if column J is not empty */
	if (k1 > k2) {
	    goto L95;
	}
	vj = rinf;
	i__2 = k2;
	for (k = k1; k <= i__2; ++k) {
	    i__ = irn[k];
	    di = a[k] - u[i__];
	    if (di > vj) {
		goto L50;
	    }
	    if (di < vj || di == rinf) {
		goto L55;
	    }
	    if (iperm[i__] != 0 || iperm[i0] == 0) {
		goto L50;
	    }
L55:
	    vj = di;
	    i0 = i__;
	    k0 = k;
L50:
	    ;
	}
	d__[j] = vj;
	k = k0;
	i__ = i0;
	if (iperm[i__] == 0) {
	    goto L90;
	}
	i__2 = k2;
	for (k = k0; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] - u[i__] > vj) {
		goto L60;
	    }
	    jj = iperm[i__];
/* Scan remaining part of assigned column JJ */
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L60;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] > 0) {
		    goto L70;
		}
		if (a[kk] - u[ii] <= d__[jj]) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L60:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = kk;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = k;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = rinf;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
/* JORD is next unmatched column */
/* DMIN is the length of shortest path in the tree */
	dmin__ = rinf;
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is the cost of the shortest augmenting path to unassigned row */
/* IRN(ISP). The corresponding column index is JSP. */
	csp = rinf;
/* Build shortest path tree starting from unassigned column (root) JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = a[k] - u[i__];
	    if (dnew >= csp) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
		csp = dnew;
		isp = k;
		jsp = j;
	    } else {
		if (dnew < dmin__) {
		    dmin__ = dnew;
		}
		d__[i__] = dnew;
		++qlen;
		q[qlen] = k;
	    }
L115:
	    ;
	}
/* Initialize heap Q and Q2 with rows held in Q(1:QLEN) */
	q0 = qlen;
	qlen = 0;
	i__2 = q0;
	for (kk = 1; kk <= i__2; ++kk) {
	    k = q[kk];
	    i__ = irn[k];
	    if (csp <= d__[i__]) {
		d__[i__] = rinf;
		goto L120;
	    }
	    if (d__[i__] <= dmin__) {
		--low;
		q[low] = i__;
		l[i__] = low;
	    } else {
		++qlen;
		l[i__] = qlen;
		mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
	    }
/* Update tree */
	    jj = iperm[i__];
	    out[jj] = k;
	    pr[jj] = j;
L120:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (d__[i__] >= csp) {
		    goto L160;
		}
		dmin__ = d__[i__];
L152:
		mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__2);
		--low;
		q[low] = i__;
		l[i__] = low;
		if (qlen == 0) {
		    goto L153;
		}
		i__ = q[1];
		if (d__[i__] > dmin__) {
		    goto L153;
		}
		goto L152;
	    }
/* Q0 is row whose distance D(Q0) to the root is smallest */
L153:
	    q0 = q[up - 1];
	    dq0 = d__[q0];
/* Exit loop if path to Q0 is longer than the shortest augmenting path */
	    if (dq0 >= csp) {
		goto L160;
	    }
	    --up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    vj = dq0 - a[jperm[j]] + u[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
		if (l[i__] >= up) {
		    goto L155;
		}
/* DNEW is new cost */
		dnew = vj + a[k] - u[i__];
/* Do not update D(I) if DNEW ge cost of shortest path */
		if (dnew >= csp) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unmatched; update shortest path info */
		    csp = dnew;
		    isp = k;
		    jsp = j;
		} else {
/* Row I is matched; do not update D(I) if DNEW is larger */
		    di = d__[i__];
		    if (di <= dnew) {
			goto L155;
		    }
		    if (l[i__] >= low) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew <= dmin__) {
			if (l[i__] != 0) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__2);
			}
			--low;
			q[low] = i__;
			l[i__] = low;
		    } else {
			if (l[i__] == 0) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
		    }
/* Update tree */
		    jj = iperm[i__];
		    out[jj] = k;
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = RINF, no augmenting path is found */
L160:
	if (csp == rinf) {
	    goto L190;
	}
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = irn[isp];
	iperm[i__] = jsp;
	jperm[jsp] = isp;
	j = jsp;
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    jj = pr[j];
	    if (jj == -1) {
		goto L180;
	    }
	    k = out[j];
	    i__ = irn[k];
	    iperm[i__] = jj;
	    jperm[jj] = k;
	    j = jj;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
/* Update U for rows in Q(UP:N) */
L180:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    u[i__] = u[i__] + d__[i__] - csp;
/* L185: */
	}
L190:
	i__2 = *n;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* Set dual column variable in D(1:N) */
L1000:
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	k = jperm[j];
	if (k != 0) {
	    d__[j] = a[k] - u[irn[k]];
	} else {
	    d__[j] = 0.;
	}
	if (iperm[j] == 0) {
	    u[j] = 0.;
	}
/* L200: */
    }
    if (*num == *n) {
	goto L1100;
    }
/* The matrix is structurally singular, complete IPERM. */
/* JPERM, OUT are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    out[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L320;
	}
	++k;
	jdum = out[k];
	iperm[jdum] = j;
L320:
	;
    }
L1100:
    return 0;
}